

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH3_state_t * VELOCYPACK_XXH3_createState(void)

{
  void *pvVar1;
  XXH3_state_t *pXVar2;
  ulong uVar3;
  long lVar4;
  
  pvVar1 = malloc(0x280);
  if (pvVar1 == (void *)0x0) {
    pXVar2 = (XXH3_state_t *)0x0;
  }
  else {
    uVar3 = (ulong)((uint)pvVar1 & 0x3f);
    lVar4 = 0x40 - uVar3;
    pXVar2 = (XXH3_state_t *)((long)pvVar1 + lVar4);
    *(char *)((long)pvVar1 + (0x3f - uVar3)) = (char)lVar4;
  }
  if (pXVar2 == (XXH3_state_t *)0x0) {
    pXVar2 = (XXH3_state_t *)0x0;
  }
  else {
    pXVar2->seed = 0;
  }
  return pXVar2;
}

Assistant:

XXH_PUBLIC_API XXH3_state_t* XXH3_createState(void) {
  XXH3_state_t* const state =
      (XXH3_state_t*)XXH_alignedMalloc(sizeof(XXH3_state_t), 64);
  if (state == NULL) return NULL;
  XXH3_INITSTATE(state);
  return state;
}